

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EverCrypt_Curve25519.c
# Opt level: O1

void EverCrypt_Curve25519_secret_to_public(uint8_t *pub,uint8_t *priv)

{
  _Bool _Var1;
  _Bool _Var2;
  
  _Var1 = EverCrypt_AutoConfig2_has_bmi2();
  _Var2 = EverCrypt_AutoConfig2_has_adx();
  if (_Var2 && _Var1) {
    Hacl_Curve25519_64_secret_to_public(pub,priv);
    return;
  }
  Hacl_Curve25519_51_secret_to_public(pub,priv);
  return;
}

Assistant:

void EverCrypt_Curve25519_secret_to_public(uint8_t *pub, uint8_t *priv)
{
  #if HACL_CAN_COMPILE_VALE
  bool has_bmi2 = EverCrypt_AutoConfig2_has_bmi2();
  bool has_adx = EverCrypt_AutoConfig2_has_adx();
  if (has_bmi2 && has_adx)
  {
    Hacl_Curve25519_64_secret_to_public(pub, priv);
    return;
  }
  Hacl_Curve25519_51_secret_to_public(pub, priv);
  #else
  Hacl_Curve25519_51_secret_to_public(pub, priv);
  #endif
}